

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

bool __thiscall cmCTestGIT::UpdateByFetchAndReset(cmCTestGIT *this)

{
  pointer *__x;
  undefined1 *this_00;
  cmCTest *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  ostream *poVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_628;
  bool local_5d9;
  string local_578;
  undefined1 local_558 [8];
  OutputLogger reset_err;
  OutputLogger reset_out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  iterator local_448;
  size_type local_440;
  undefined1 local_438 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_reset;
  size_type pos;
  string line;
  ifstream fin;
  string local_1f0;
  undefined1 local_1d0 [8];
  string fetch_head;
  string sha1;
  undefined1 local_188 [8];
  OutputLogger fetch_err;
  OutputLogger fetch_out;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string local_e8;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_80 [8];
  string opts;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_fetch;
  string git;
  cmCTestGIT *this_local;
  
  __x = &git_fetch.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string
            ((string *)__x,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50,(value_type *)__x);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[6]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_50,
             (char (*) [6])"fetch");
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"UpdateOptions",&local_a1);
  cmCTest::GetCTestConfiguration((string *)local_80,pcVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"GITUpdateOptions",
               (allocator<char> *)
               ((long)&args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmCTest::GetCTestConfiguration(&local_c8,pcVar1,&local_e8);
    std::__cxx11::string::operator=((string *)local_80,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  cmSystemTools::ParseArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&fetch_out.super_LineParser.Separator,(string *)local_80);
  ::cm::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&fetch_out.super_LineParser.Separator);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&fetch_err.super_LineParser.Separator,
             (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"fetch-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_188,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "fetch-err> ");
  bVar2 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_50,(OutputParser *)&fetch_err.super_LineParser.Separator,
                     (OutputParser *)local_188,Auto);
  if (bVar2) {
    std::__cxx11::string::string((string *)(fetch_head.field_2._M_local_buf + 8));
    FindGitDir_abi_cxx11_(&local_1f0,this);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   &local_1f0,"/FETCH_HEAD");
    std::__cxx11::string::~string((string *)&local_1f0);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    _Var4 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream((void *)((long)&line.field_2 + 8),pcVar7,_Var4);
    bVar3 = std::ios::operator!((ios *)((long)&line.field_2 +
                                       *(long *)(line.field_2._8_8_ + -0x18) + 8));
    if ((bVar3 & 1) == 0) {
      std::__cxx11::string::string((string *)&pos);
      while( true ) {
        uVar5 = std::__cxx11::string::empty();
        local_5d9 = false;
        if ((uVar5 & 1) != 0) {
          local_5d9 = cmsys::SystemTools::GetLineFromStream
                                ((istream *)((long)&line.field_2 + 8),(string *)&pos,(bool *)0x0,
                                 0xffffffffffffffff);
        }
        if (local_5d9 == false) break;
        poVar8 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"FETCH_HEAD> ");
        poVar8 = std::operator<<(poVar8,(string *)&pos);
        std::operator<<(poVar8,"\n");
        lVar9 = std::__cxx11::string::find((char *)&pos,0x122b105);
        if ((lVar9 == -1) &&
           (git_reset.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)std::__cxx11::string::find((char)&pos,9),
           git_reset.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0xffffffffffffffff)) {
          std::__cxx11::string::operator=
                    ((string *)(fetch_head.field_2._M_local_buf + 8),(string *)&pos);
          std::__cxx11::string::resize((ulong)(fetch_head.field_2._M_local_buf + 8));
        }
      }
      uVar6 = std::__cxx11::string::empty();
      bVar2 = (uVar6 & 1) != 0;
      if (bVar2) {
        std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                        "FETCH_HEAD has no upstream branch candidate!\n");
        this_local._7_1_ = 0;
      }
      std::__cxx11::string::~string((string *)&pos);
    }
    else {
      poVar8 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Unable to open ");
      poVar8 = std::operator<<(poVar8,(string *)local_1d0);
      std::operator<<(poVar8,"\n");
      this_local._7_1_ = 0;
      bVar2 = true;
    }
    std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
    std::__cxx11::string::~string((string *)local_1d0);
    if (!bVar2) {
      reset_out.super_LineParser._61_1_ = 1;
      std::__cxx11::string::string
                ((string *)&local_4c8,
                 (string *)
                 &git_fetch.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_4a8,"reset",(allocator<char> *)&reset_out.super_LineParser.field_0x3f);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_488,"--hard",(allocator<char> *)&reset_out.super_LineParser.field_0x3e);
      std::__cxx11::string::string(local_468,(string *)(fetch_head.field_2._M_local_buf + 8));
      reset_out.super_LineParser._61_1_ = 0;
      local_448 = &local_4c8;
      local_440 = 4;
      this_00 = &reset_out.super_LineParser.field_0x3c;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
      __l._M_len = local_440;
      __l._M_array = local_448;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_438,__l,(allocator_type *)this_00);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&reset_out.super_LineParser.field_0x3c);
      local_628 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_448;
      do {
        local_628 = local_628 + -1;
        std::__cxx11::string::~string((string *)local_628);
      } while (local_628 != &local_4c8);
      std::allocator<char>::~allocator((allocator<char> *)&reset_out.super_LineParser.field_0x3e);
      std::allocator<char>::~allocator((allocator<char> *)&reset_out.super_LineParser.field_0x3f);
      cmProcessTools::OutputLogger::OutputLogger
                ((OutputLogger *)&reset_err.super_LineParser.Separator,
                 (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"reset-out> ");
      cmProcessTools::OutputLogger::OutputLogger
                ((OutputLogger *)local_558,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                 "reset-err> ");
      std::__cxx11::string::string((string *)&local_578);
      this_local._7_1_ =
           cmCTestVC::RunChild((cmCTestVC *)this,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_438,(OutputParser *)&reset_err.super_LineParser.Separator,
                               (OutputParser *)local_558,&local_578,Auto);
      std::__cxx11::string::~string((string *)&local_578);
      cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_558);
      cmProcessTools::OutputLogger::~OutputLogger
                ((OutputLogger *)&reset_err.super_LineParser.Separator);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_438);
    }
    std::__cxx11::string::~string((string *)(fetch_head.field_2._M_local_buf + 8));
  }
  else {
    this_local._7_1_ = 0;
  }
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_188);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)&fetch_err.super_LineParser.Separator)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&fetch_out.super_LineParser.Separator);
  std::__cxx11::string::~string((string *)local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::__cxx11::string::~string
            ((string *)
             &git_fetch.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestGIT::UpdateByFetchAndReset()
{
  std::string git = this->CommandLineTool;

  // Use "git fetch" to get remote commits.
  std::vector<std::string> git_fetch;
  git_fetch.push_back(git);
  git_fetch.emplace_back("fetch");

  // Add user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("GITUpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);
  cm::append(git_fetch, args);

  // Fetch upstream refs.
  OutputLogger fetch_out(this->Log, "fetch-out> ");
  OutputLogger fetch_err(this->Log, "fetch-err> ");
  if (!this->RunUpdateCommand(git_fetch, &fetch_out, &fetch_err)) {
    return false;
  }

  // Identify the merge head that would be used by "git pull".
  std::string sha1;
  {
    std::string fetch_head = this->FindGitDir() + "/FETCH_HEAD";
    cmsys::ifstream fin(fetch_head.c_str(), std::ios::in | std::ios::binary);
    if (!fin) {
      this->Log << "Unable to open " << fetch_head << "\n";
      return false;
    }
    std::string line;
    while (sha1.empty() && cmSystemTools::GetLineFromStream(fin, line)) {
      this->Log << "FETCH_HEAD> " << line << "\n";
      if (line.find("\tnot-for-merge\t") == std::string::npos) {
        std::string::size_type pos = line.find('\t');
        if (pos != std::string::npos) {
          sha1 = std::move(line);
          sha1.resize(pos);
        }
      }
    }
    if (sha1.empty()) {
      this->Log << "FETCH_HEAD has no upstream branch candidate!\n";
      return false;
    }
  }

  // Reset the local branch to point at that tracked from upstream.
  std::vector<std::string> git_reset = { git, "reset", "--hard", sha1 };
  OutputLogger reset_out(this->Log, "reset-out> ");
  OutputLogger reset_err(this->Log, "reset-err> ");
  return this->RunChild(git_reset, &reset_out, &reset_err);
}